

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O2

void Fxu_HeapSingleCheckOne(Fxu_HeapSingle *p,Fxu_Single *pSingle)

{
  uint uVar1;
  
  uVar1 = pSingle->HNum * 2;
  if (((int)uVar1 <= p->nItems) && (pSingle->Weight < p->pTree[(int)uVar1]->Weight)) {
    __assert_fail("Weight1 >= Weight2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuHeapS.c"
                  ,0xb7,"void Fxu_HeapSingleCheckOne(Fxu_HeapSingle *, Fxu_Single *)");
  }
  if (((int)uVar1 < p->nItems) && (pSingle->Weight < p->pTree[(int)(uVar1 | 1)]->Weight)) {
    __assert_fail("Weight1 >= Weight2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuHeapS.c"
                  ,0xbd,"void Fxu_HeapSingleCheckOne(Fxu_HeapSingle *, Fxu_Single *)");
  }
  return;
}

Assistant:

void Fxu_HeapSingleCheckOne( Fxu_HeapSingle * p, Fxu_Single * pSingle )
{
    int Weight1, Weight2;
    if ( FXU_HEAP_SINGLE_CHILD1_EXISTS(p,pSingle) )
    {
        Weight1 = FXU_HEAP_SINGLE_WEIGHT(pSingle);
        Weight2 = FXU_HEAP_SINGLE_WEIGHT( FXU_HEAP_SINGLE_CHILD1(p,pSingle) );
        assert( Weight1 >= Weight2 );
    }
    if ( FXU_HEAP_SINGLE_CHILD2_EXISTS(p,pSingle) )
    {
        Weight1 = FXU_HEAP_SINGLE_WEIGHT(pSingle);
        Weight2 = FXU_HEAP_SINGLE_WEIGHT( FXU_HEAP_SINGLE_CHILD2(p,pSingle) );
        assert( Weight1 >= Weight2 );
    }
}